

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindowPrivate::setMinimizeMode(QMdiSubWindowPrivate *this)

{
  QMdiSubWindow *this_00;
  
  this_00 = *(QMdiSubWindow **)&(this->super_QWidgetPrivate).field_0x8;
  ensureWindowState(this,WindowMinimized);
  this->isShadeRequestFromMinimizeMode = true;
  QMdiSubWindow::showShaded(this_00);
  this->isShadeRequestFromMinimizeMode = false;
  this->moveEnabled = false;
  setEnabled(this,MoveAction,false);
  setActive(this,true,true);
  return;
}

Assistant:

void QMdiSubWindowPrivate::setMinimizeMode()
{
    Q_Q(QMdiSubWindow);
    Q_ASSERT(parent);

    ensureWindowState(Qt::WindowMinimized);
    isShadeRequestFromMinimizeMode = true;
    q->showShaded();
    isShadeRequestFromMinimizeMode = false;

    moveEnabled = false;
#ifndef QT_NO_ACTION
    setEnabled(MoveAction, moveEnabled);
#endif

    Q_ASSERT(q->windowState() & Qt::WindowMinimized);
    Q_ASSERT(!(q->windowState() & Qt::WindowMaximized));
    // This should be a valid assert, but people can actually re-implement
    // setVisible and do crazy stuff, so we're not guaranteed that
    // the widget is hidden after calling hide().
    // Q_ASSERT(baseWidget ? baseWidget->isHidden() : true);

    setActive(true);
}